

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEdge.c
# Opt level: O2

int Edg_ManEvalEdgeDelayR(Gia_Man_t *p)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  Vec_Int_t *pVVar5;
  int in_EDX;
  int iVar6;
  int i;
  int Id;
  
  if ((p->vEdge1 != (Vec_Int_t *)0x0) && (p->vEdge2 != (Vec_Int_t *)0x0)) {
    if (p->vEdgeDelayR == (Vec_Int_t *)0x0) {
      pVVar5 = Vec_IntStart(p->nObjs);
      p->vEdgeDelayR = pVVar5;
    }
    else {
      Vec_IntFill(p->vEdgeDelayR,p->nObjs,in_EDX);
    }
    Id = p->nObjs;
    iVar6 = 0;
    while( true ) {
      do {
        if (Id < 2) {
          return iVar6;
        }
        Id = Id + -1;
        iVar1 = Gia_ObjIsLut2(p,Id);
      } while (iVar1 == 0);
      pVVar5 = p->vEdgeDelayR;
      iVar1 = Gia_ObjIsLut2(p,Id);
      if (iVar1 == 0) break;
      iVar1 = 0;
      for (i = 0; iVar2 = Gia_ObjLutFanoutNum2(p,Id), i < iVar2; i = i + 1) {
        iVar2 = Gia_ObjLutFanout2(p,Id,i);
        iVar3 = Vec_IntEntry(pVVar5,iVar2);
        uVar4 = Gia_ObjHaveEdge(p,Id,iVar2);
        iVar3 = (uVar4 ^ 1) + iVar3;
        if (iVar1 <= iVar3) {
          iVar1 = iVar3;
        }
      }
      Vec_IntWriteEntry(p->vEdgeDelayR,Id,iVar1);
      if (iVar6 <= iVar1) {
        iVar6 = iVar1;
      }
    }
    __assert_fail("Gia_ObjIsLut2(p, iObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEdge.c"
                  ,0x2d3,"int Edg_ObjEvalEdgeDelayR(Gia_Man_t *, int, Vec_Int_t *)");
  }
  __assert_fail("p->vEdge1 && p->vEdge2",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEdge.c"
                ,0x2e0,"int Edg_ManEvalEdgeDelayR(Gia_Man_t *)");
}

Assistant:

int Edg_ManEvalEdgeDelayR( Gia_Man_t * p )
{
//    int k, DelayNoEdge = 1;
    int iLut, Delay, DelayMax = 0;
    assert( p->vEdge1 && p->vEdge2 );
    if ( p->vEdgeDelayR == NULL )
        p->vEdgeDelayR = Vec_IntStart( Gia_ManObjNum(p) );
    else
        Vec_IntFill( p->vEdgeDelayR, Gia_ManObjNum(p), 0 );
//    Gia_ManForEachCoDriverId( p, iLut, k )
//        Vec_IntWriteEntry( p->vEdgeDelayR, iLut, DelayNoEdge );
    Gia_ManForEachLut2Reverse( p, iLut )
    {
        Delay = Edg_ObjEvalEdgeDelayR(p, iLut, p->vEdgeDelayR);
        Vec_IntWriteEntry( p->vEdgeDelayR, iLut, Delay );
        DelayMax = Abc_MaxInt( DelayMax, Delay );
    }
    return DelayMax;
}